

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall
tonk::gateway::StateMachine::BeginControlSOAPRequests(StateMachine *this,int controlIndex)

{
  LogStringBuffer *pLVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  int in_ESI;
  long in_RDI;
  AppRequest app;
  ControlRequest *controlRequest;
  int requestIndex;
  int requestCount;
  uint64_t nowUsec;
  ControlEndpoint *control;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  SSDPRequester *in_stack_fffffffffffff4d8;
  LogStringBuffer *in_stack_fffffffffffff4e0;
  size_type in_stack_fffffffffffff4f8;
  vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
  *in_stack_fffffffffffff500;
  undefined1 *puVar6;
  LogStringBuffer *in_stack_fffffffffffff518;
  OutputWorker *in_stack_fffffffffffff520;
  uint64_t in_stack_fffffffffffff548;
  HTTPRequester *in_stack_fffffffffffff550;
  undefined8 local_a50;
  MappedPortLifetime *local_a48;
  reference local_a40;
  int local_a38;
  int local_a34;
  uint64_t local_a30;
  reference local_a28;
  uint16_t *local_a10;
  char *local_a08;
  ushort *local_a00;
  char *local_9f8;
  undefined8 *local_9f0;
  undefined8 *local_9e8;
  char *local_9e0;
  undefined8 *local_9d8;
  uint16_t *local_9d0;
  char *local_9c8;
  ushort *local_9c0;
  char *local_9b8;
  undefined8 *local_9b0;
  uint16_t *local_9a8;
  char *local_9a0;
  ushort *local_998;
  char *local_990;
  undefined4 local_984;
  undefined8 *local_980;
  undefined4 local_974;
  undefined8 *local_970;
  undefined1 local_958 [16];
  ostream aoStack_948 [376];
  uint16_t *local_7d0;
  char *local_7c8;
  ushort *local_7c0;
  char *local_7b8;
  undefined4 local_7ac;
  undefined8 *local_7a8;
  uint16_t *local_7a0;
  char *local_798;
  ushort *local_790;
  char *local_788;
  undefined *local_780;
  undefined1 *local_778;
  undefined8 *local_770;
  undefined *local_768;
  undefined1 *local_760;
  undefined8 *local_758;
  undefined *local_750;
  undefined1 *local_748;
  uint16_t *local_740;
  char *local_738;
  ushort *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined8 *local_718;
  char *local_710;
  undefined1 *local_708;
  undefined8 *local_700;
  uint16_t *local_6f8;
  char *local_6f0;
  ushort *local_6e8;
  undefined1 *local_6e0;
  undefined8 *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  ushort *local_6c0;
  undefined1 *local_6b8;
  undefined8 *local_6b0;
  uint16_t *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined8 *local_690;
  ushort *local_688;
  undefined1 *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined8 *local_668;
  uint16_t *local_660;
  undefined1 *local_658;
  undefined8 *local_650;
  uint16_t *local_648;
  undefined1 *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined8 *local_628;
  char *local_620;
  undefined4 local_614;
  undefined8 *local_610;
  undefined4 local_604;
  undefined8 *local_600;
  ostream aoStack_5d8 [104];
  int in_stack_fffffffffffffa90;
  int in_stack_fffffffffffffa94;
  StateMachine *in_stack_fffffffffffffa98;
  undefined1 local_330 [392];
  uint16_t *local_1a8;
  char *local_1a0;
  ushort *local_198;
  char *local_190;
  undefined4 local_184;
  undefined8 *local_180;
  uint16_t *local_178;
  char *local_170;
  ushort *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  LogStringBuffer *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  LogStringBuffer *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  uint16_t *local_118;
  char *local_110;
  ushort *local_108;
  char *local_100;
  undefined1 *local_f8;
  LogStringBuffer *local_f0;
  uint16_t *local_e8;
  char *local_e0;
  ushort *local_d8;
  undefined1 *local_d0;
  LogStringBuffer *local_c8;
  ushort *local_c0;
  undefined1 *local_b8;
  LogStringBuffer *local_b0;
  uint16_t *local_a8;
  char *local_a0;
  undefined1 *local_98;
  LogStringBuffer *local_90;
  ushort *local_88;
  undefined1 *local_80;
  char *local_78;
  undefined1 *local_70;
  LogStringBuffer *local_68;
  uint16_t *local_60;
  undefined1 *local_58;
  LogStringBuffer *local_50;
  uint16_t *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  LogStringBuffer *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_a28 = std::
              vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
              ::operator[]((vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                            *)(in_RDI + 0x88),(long)in_ESI);
  local_a30 = siamese::GetTimeUsec();
  sVar3 = std::vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>::size
                    ((vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
                      *)(in_RDI + 0x58));
  local_a34 = (int)sVar3;
  sVar4 = std::vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
          ::size(&local_a28->Requests);
  if ((int)sVar3 != (int)sVar4) {
    std::vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>::
    resize(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
  }
  local_a38 = 0;
  do {
    if (local_a34 <= local_a38) {
      return;
    }
    local_a40 = std::
                vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
                ::operator[](&local_a28->Requests,(long)local_a38);
    pvVar5 = std::vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>::
             operator[]((vector<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
                         *)(in_RDI + 0x58),(long)local_a38);
    local_a50._0_2_ = pvVar5->LocalPort;
    local_a50._2_2_ = *(undefined2 *)&pvVar5->field_0x2;
    local_a50._4_4_ = pvVar5->Type;
    local_a48 = pvVar5->API_LifetimePtr;
    bVar2 = std::operator!=(in_stack_fffffffffffff4e0,
                            (shared_ptr<tonk::gateway::HTTPRequester> *)in_stack_fffffffffffff4d8);
    if (bVar2) {
      std::
      __shared_ptr_access<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x19f4d2);
      bVar2 = HTTPRequester::OnTick_IsDisposable
                        (in_stack_fffffffffffff550,in_stack_fffffffffffff548);
      if (bVar2) {
        std::shared_ptr<tonk::gateway::HTTPRequester>::shared_ptr
                  ((shared_ptr<tonk::gateway::HTTPRequester> *)in_stack_fffffffffffff4e0,
                   in_stack_fffffffffffff4d8);
        std::shared_ptr<tonk::gateway::HTTPRequester>::operator=
                  ((shared_ptr<tonk::gateway::HTTPRequester> *)in_stack_fffffffffffff4e0,
                   (shared_ptr<tonk::gateway::HTTPRequester> *)in_stack_fffffffffffff4d8);
        std::shared_ptr<tonk::gateway::HTTPRequester>::~shared_ptr
                  ((shared_ptr<tonk::gateway::HTTPRequester> *)0x19f51f);
        goto LAB_0019f528;
      }
    }
    else {
LAB_0019f528:
      if (local_a40->LastApp != local_a50._4_4_) {
        local_a40->LastApp = local_a50._4_4_;
        if ((local_a50._4_4_ == Remove) && (local_a40->AddedExternalPort != 0)) {
          local_a40->RetriesRemaining = 3;
          local_a40->AddAgainOnTimer = false;
          local_a00 = (ushort *)&local_a50;
          local_a10 = &local_a40->AddedExternalPort;
          local_9f0 = &ModuleLogger;
          local_9f8 = "Removing the gateway port mapping for local:";
          local_a08 = " <-> external:";
          local_980 = &ModuleLogger;
          local_984 = 1;
          local_990 = "Removing the gateway port mapping for local:";
          local_9a0 = " <-> external:";
          local_970 = &ModuleLogger;
          local_974 = 1;
          local_9a8 = local_a10;
          local_998 = local_a00;
          if (DAT_002b61e8 < 2) {
            local_7a8 = &ModuleLogger;
            local_7ac = 1;
            local_7b8 = "Removing the gateway port mapping for local:";
            local_7c8 = " <-> external:";
            local_7d0 = local_a10;
            local_7c0 = local_a00;
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,Trace);
            local_780 = &DAT_002b6218;
            local_770 = &ModuleLogger;
            local_788 = local_7b8;
            local_790 = local_7c0;
            local_798 = local_7c8;
            local_7a0 = local_7d0;
            local_758 = &ModuleLogger;
            local_778 = local_958;
            local_768 = local_780;
            local_760 = local_958;
            local_750 = local_780;
            local_748 = local_958;
            std::operator<<(aoStack_948,(string *)&DAT_002b6218);
            local_718 = &ModuleLogger;
            local_720 = local_778;
            local_728 = local_788;
            local_730 = local_790;
            local_738 = local_798;
            local_740 = local_7a0;
            local_700 = &ModuleLogger;
            local_708 = local_778;
            local_710 = local_788;
            local_6c8 = local_778;
            local_6d0 = local_788;
            std::operator<<((ostream *)(local_778 + 0x10),local_788);
            local_6d8 = &ModuleLogger;
            local_6e0 = local_720;
            local_6e8 = local_730;
            local_6f0 = local_738;
            local_6f8 = local_740;
            local_6b0 = &ModuleLogger;
            local_6b8 = local_720;
            local_6c0 = local_730;
            local_680 = local_720;
            local_688 = local_730;
            std::ostream::operator<<((ostream *)(local_720 + 0x10),*local_730);
            local_690 = &ModuleLogger;
            local_698 = local_6e0;
            local_6a0 = local_6f0;
            local_6a8 = local_6f8;
            local_668 = &ModuleLogger;
            local_670 = local_6e0;
            local_678 = local_6f0;
            local_630 = local_6e0;
            local_638 = local_6f0;
            std::operator<<((ostream *)(local_6e0 + 0x10),local_6f0);
            local_650 = &ModuleLogger;
            local_658 = local_698;
            local_660 = local_6a8;
            local_640 = local_698;
            local_648 = local_6a8;
            std::ostream::operator<<((ostream *)(local_698 + 0x10),*local_6a8);
            in_stack_fffffffffffff550 = (HTTPRequester *)logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x19fb17);
          }
        }
        else if ((local_a50._4_4_ == Add) && (local_a40->AddedExternalPort == 0)) {
          local_a40->RetriesRemaining = 3;
          local_9e8 = &local_a50;
          local_9d8 = &ModuleLogger;
          local_9e0 = "Adding the gateway port mapping for local:";
          local_610 = &ModuleLogger;
          local_614 = 1;
          local_620 = "Adding the gateway port mapping for local:";
          local_600 = &ModuleLogger;
          local_604 = 1;
          local_628 = local_9e8;
          if (DAT_002b61e8 < 2) {
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,Trace);
            std::operator<<(aoStack_5d8,(string *)&DAT_002b6218);
            in_stack_fffffffffffff520 = (OutputWorker *)&ModuleLogger;
            std::operator<<(aoStack_5d8,"Adding the gateway port mapping for local:");
            std::ostream::operator<<(aoStack_5d8,(ushort)local_a50);
            in_stack_fffffffffffff518 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x19fe8f);
          }
        }
      }
      if ((((local_a50._4_4_ == 0) && ((local_a40->AddAgainOnTimer & 1U) != 0)) &&
          (local_a40->AddedExternalPort != 0)) &&
         (170000000 < local_a30 - local_a40->LastSuccessUsec)) {
        local_a40->RetriesRemaining = 3;
        local_9c0 = (ushort *)&local_a50;
        local_9d0 = &local_a40->AddedExternalPort;
        local_9b0 = &ModuleLogger;
        local_9b8 = "Time to renew the gateway port mapping for local:";
        local_9c8 = " <-> external:";
        if (DAT_002b61e8 < 2) {
          local_180 = &ModuleLogger;
          local_184 = 1;
          local_190 = "Time to renew the gateway port mapping for local:";
          local_1a0 = " <-> external:";
          puVar6 = local_330;
          pLVar1 = (LogStringBuffer *)&ModuleLogger;
          local_1a8 = local_9d0;
          local_198 = local_9c0;
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_fffffffffffff4e0,(char *)in_stack_fffffffffffff4d8,Trace);
          in_stack_fffffffffffff4e0 = pLVar1;
          local_158 = &in_stack_fffffffffffff4e0->field_0x38;
          local_160 = local_190;
          local_168 = local_198;
          local_170 = local_1a0;
          local_178 = local_1a8;
          local_150 = puVar6;
          local_148 = in_stack_fffffffffffff4e0;
          local_140 = local_158;
          local_138 = puVar6;
          local_130 = in_stack_fffffffffffff4e0;
          local_128 = local_158;
          local_120 = puVar6;
          std::operator<<((ostream *)(puVar6 + 0x10),(string *)local_158);
          local_f8 = local_150;
          local_100 = local_160;
          local_108 = local_168;
          local_110 = local_170;
          local_118 = local_178;
          local_20 = local_150;
          local_28 = local_160;
          local_8 = local_150;
          local_10 = local_160;
          local_f0 = in_stack_fffffffffffff4e0;
          local_18 = in_stack_fffffffffffff4e0;
          std::operator<<((ostream *)(local_150 + 0x10),local_160);
          local_d0 = local_f8;
          local_d8 = local_108;
          local_e0 = local_110;
          local_e8 = local_118;
          local_b8 = local_f8;
          local_c0 = local_108;
          local_80 = local_f8;
          local_88 = local_108;
          local_c8 = in_stack_fffffffffffff4e0;
          local_b0 = in_stack_fffffffffffff4e0;
          std::ostream::operator<<((ostream *)(local_f8 + 0x10),*local_108);
          local_98 = local_d0;
          local_a0 = local_e0;
          local_a8 = local_e8;
          local_70 = local_d0;
          local_78 = local_e0;
          local_30 = local_d0;
          local_38 = local_e0;
          local_90 = in_stack_fffffffffffff4e0;
          local_68 = in_stack_fffffffffffff4e0;
          std::operator<<((ostream *)(local_d0 + 0x10),local_e0);
          local_58 = local_98;
          local_60 = local_a8;
          local_40 = local_98;
          local_48 = local_a8;
          local_50 = in_stack_fffffffffffff4e0;
          std::ostream::operator<<((ostream *)(local_98 + 0x10),*local_a8);
          in_stack_fffffffffffff4d8 = (SSDPRequester *)logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1a0448);
        }
      }
      bVar2 = SSDPRequester::IsNetworkDefinitelyDown(in_stack_fffffffffffff4d8);
      if ((!bVar2) && (0 < local_a40->RetriesRemaining)) {
        local_a40->RetriesRemaining = local_a40->RetriesRemaining + -1;
        RequestSOAP(in_stack_fffffffffffffa98,in_stack_fffffffffffffa94,in_stack_fffffffffffffa90);
      }
    }
    local_a38 = local_a38 + 1;
  } while( true );
}

Assistant:

void StateMachine::BeginControlSOAPRequests(int controlIndex)
{
    ControlEndpoint& control = ControlEndpoints[controlIndex];

    // Get current time
    const uint64_t nowUsec = siamese::GetTimeUsec();

    // Resize requests
    const int requestCount = (int)Requests.size();
    if (requestCount != (int)control.Requests.size()) {
        control.Requests.resize(requestCount);
    }

    // Check each request
    for (int requestIndex = 0; requestIndex < requestCount; ++requestIndex)
    {
        ControlRequest& controlRequest = control.Requests[requestIndex];
        const AppRequest app = Requests[requestIndex];

        // If HTTP request is already in progress:
        if (nullptr != controlRequest.Requester)
        {
            // If the requester is dead:
            if (controlRequest.Requester->OnTick_IsDisposable(nowUsec)) {
                // Free it so we can try again
                controlRequest.Requester = nullptr;
            }
            else {
                continue;
            }
        }

        // The application request type can fluctuate between Add/Remove at any time.

        // If the app request has changed:
        if (controlRequest.LastApp != app.Type)
        {
            controlRequest.LastApp = app.Type;

            if (app.Type == RequestType::Remove &&
                controlRequest.AddedExternalPort != 0)
            {
                // The app is requesting a remove and we had added a mapping
                controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

                // Reset some state in case we want to add it again later
                controlRequest.AddAgainOnTimer = false;

                ModuleLogger.Debug("Removing the gateway port mapping for local:",
                    app.LocalPort, " <-> external:", controlRequest.AddedExternalPort);
            }
            else if (app.Type == RequestType::Add &&
                controlRequest.AddedExternalPort == 0)
            {
                // The app is requesting to add and we do not have a mapping
                controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

                ModuleLogger.Debug("Adding the gateway port mapping for local:",
                    app.LocalPort);
            }
        }

        // If an external port was added successfully some time ago:
        if (app.Type == RequestType::Add &&
            controlRequest.AddAgainOnTimer &&
            controlRequest.AddedExternalPort != 0 &&
            nowUsec - controlRequest.LastSuccessUsec > protocol::kUPnPLeaseRenewSecs * 1000 * 1000)
        {
            /*
                Keep retrying forever after the lease renew interval elapses.

                This handles the case where the network goes down after a port
                is mapped, so the LAN info is still unchanged in Windows (same
                Local IP and same Gateway).  While the network is down, this
                causes continuous HTTP requests from the control endpoint about
                once per second until the uplink is restored or the LAN changes.

                LAN changes clear the AddAgainOnTimer flag to exit this loop.
            */
            controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

            ModuleLogger.Debug("Time to renew the gateway port mapping for local:",
                app.LocalPort, " <-> external:", controlRequest.AddedExternalPort);
        }

        // If the network is definitely down avoid sending queries:
        if (SSDP->IsNetworkDefinitelyDown()) {
            continue;
        }

        // If there are no more retries:
        if (controlRequest.RetriesRemaining <= 0) {
            continue; // Do not retry
        }
        controlRequest.RetriesRemaining--;

        // If retries are remaining then we should perform a request
        RequestSOAP(controlIndex, requestIndex);
    }
}